

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_pasv_resp(Curl_easy *data,int ftpcode)

{
  char *pcVar1;
  undefined1 *puVar2;
  char cVar3;
  connectdata *conn;
  ConnectBits CVar4;
  curl_trc_feat *pcVar5;
  proxy_info *ppVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  CURLcode CVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  ip_quadruple *piVar14;
  bool bVar15;
  Curl_dns_entry *dns;
  curl_off_t num;
  curl_off_t num_1;
  char *p;
  Curl_dns_entry *local_158;
  char *local_150;
  Curl_easy *local_148;
  undefined4 local_140 [2];
  undefined8 local_138;
  uint local_130;
  uint local_12c;
  int local_128;
  short local_124;
  
  conn = data->conn;
  local_158 = (Curl_dns_entry *)0x0;
  pcVar11 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
  pcVar11 = pcVar11 + 4;
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (conn->proto).ftpc.newhost = (char *)0x0;
  iVar8 = (conn->proto).ftpc.count1;
  if (ftpcode == 0xe5 && iVar8 == 0) {
    pcVar12 = strchr(pcVar11,0x28);
    if (pcVar12 == (char *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      cVar3 = pcVar12[1];
      bVar15 = true;
      if (((pcVar12[2] == cVar3) && (pcVar12[3] == cVar3)) && ((byte)(pcVar12[4] - 0x30U) < 10)) {
        local_138 = pcVar12 + 4;
        iVar8 = Curl_str_number((char **)&local_138,(curl_off_t *)&local_150,0xffff);
        if ((iVar8 == 0) && (*local_138 == cVar3)) {
          (conn->proto).ftpc.newport = (unsigned_short)local_150;
          if (((ulong)conn->bits & 10) == 0) {
            piVar14 = &conn->primary;
          }
          else {
            piVar14 = (ip_quadruple *)(conn->host).name;
          }
          pcVar11 = (*Curl_cstrdup)(piVar14->remote_ip);
          (conn->proto).ftpc.newhost = pcVar11;
          bVar15 = pcVar11 != (char *)0x0;
          pcVar11 = (char *)0x1b;
        }
        else {
          bVar15 = false;
          Curl_failf(data,"Illegal port number in EPSV reply");
          pcVar11 = (char *)0xd;
        }
        pcVar12 = pcVar12 + 1;
      }
      else {
        pcVar12 = (char *)0x0;
      }
      CVar10 = (CURLcode)pcVar11;
      if (!bVar15) goto LAB_0012db95;
    }
    CVar10 = (CURLcode)pcVar11;
    bVar15 = true;
    if (pcVar12 == (char *)0x0) {
      bVar15 = false;
      Curl_failf(data,"Weirdly formatted EPSV reply");
      CVar10 = CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else {
    if (ftpcode != 0xe3 || iVar8 != 1) {
      if (iVar8 == 0) {
        CVar10 = ftp_epsv_disable(data,conn);
        return CVar10;
      }
      Curl_failf(data,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
    local_148 = data;
    if (*pcVar11 != '\0') {
      pcVar12 = pcVar11;
      do {
        uVar13 = 0;
        bVar15 = false;
        local_150 = pcVar12;
        do {
          if (uVar13 != 0) {
            if (*local_150 != ',') break;
            local_150 = local_150 + 1;
          }
          iVar8 = Curl_str_number(&local_150,(curl_off_t *)local_140,0xff);
          if (iVar8 != 0) break;
          *(undefined4 *)((long)&local_138 + uVar13 * 4) = local_140[0];
          bVar15 = 4 < uVar13;
          uVar13 = uVar13 + 1;
        } while (uVar13 != 6);
        pcVar11 = pcVar12;
      } while ((!bVar15) &&
              (pcVar11 = pcVar12 + 1, pcVar1 = pcVar12 + 1, pcVar12 = pcVar11, *pcVar1 != '\0'));
    }
    data = local_148;
    CVar10 = (CURLcode)pcVar11;
    if (*pcVar11 != '\0') {
      uVar9 = (uint)*(undefined8 *)&(local_148->set).field_0x89c;
      if ((uVar9 >> 0x13 & 1) == 0) {
        pcVar11 = curl_maprintf("%u.%u.%u.%u",(ulong)local_138 & 0xffffffff,(ulong)local_138._4_4_,
                                (ulong)local_130,(ulong)local_12c);
      }
      else {
        if (((uVar9 >> 0x1e & 1) != 0 && local_148 != (Curl_easy *)0x0) &&
           ((pcVar5 = (local_148->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
            (0 < pcVar5->log_level)))) {
          Curl_infof(local_148,"Skip %u.%u.%u.%u for data connection, reuse %s instead",
                     (ulong)local_138 & 0xffffffff,(ulong)local_138._4_4_,(ulong)local_130,
                     (ulong)local_12c,(conn->host).name);
        }
        if (((ulong)conn->bits & 10) == 0) {
          piVar14 = &conn->primary;
        }
        else {
          piVar14 = (ip_quadruple *)(conn->host).name;
        }
        pcVar11 = (*Curl_cstrdup)(piVar14->remote_ip);
      }
      (conn->proto).ftpc.newhost = pcVar11;
      if (pcVar11 == (char *)0x0) {
        CVar10 = CURLE_OUT_OF_MEMORY;
        bVar15 = false;
      }
      else {
        (conn->proto).ftpc.newport = (short)(local_128 << 8) + local_124;
        bVar15 = true;
      }
      goto LAB_0012dc63;
    }
    Curl_failf(local_148,"Couldn\'t interpret the 227-response");
    CVar10 = CURLE_FTP_WEIRD_227_FORMAT;
LAB_0012db95:
    bVar15 = false;
  }
LAB_0012dc63:
  if (!bVar15) {
    return CVar10;
  }
  CVar4 = conn->bits;
  if (((ulong)CVar4 & 0x10) == 0) {
    if (((CVar4._0_4_ & 0x800040) == 0x800000) &&
       (pcVar11 = (conn->proto).ftpc.newhost, *pcVar11 == '\0')) {
      (*Curl_cfree)(pcVar11);
      if (((ulong)conn->bits & 10) == 0) {
        piVar14 = &conn->primary;
      }
      else {
        piVar14 = (ip_quadruple *)(conn->host).name;
      }
      pcVar11 = (*Curl_cstrdup)(piVar14->remote_ip);
      (conn->proto).ftpc.newhost = pcVar11;
      if (pcVar11 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    Curl_resolv_blocking
              (data,(conn->proto).ftpc.newhost,(uint)(conn->proto).ftpc.newport,
               (uint)conn->ip_version,&local_158);
    uVar7 = (conn->proto).ftpc.newport;
    if (local_158 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"cannot resolve new host %s:%hu",(conn->proto).ftpc.newhost,(ulong)uVar7);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    ppVar6 = &conn->socks_proxy;
    if (((ulong)CVar4 & 2) == 0) {
      ppVar6 = &conn->http_proxy;
    }
    pcVar11 = (ppVar6->host).name;
    Curl_resolv_blocking(data,pcVar11,(conn->primary).remote_port,(uint)conn->ip_version,&local_158)
    ;
    uVar9 = (conn->primary).remote_port;
    uVar7 = (ushort)uVar9;
    if (local_158 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"cannot resolve proxy host %s:%hu",pcVar11,(ulong)(uVar9 & 0xffff));
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  CVar10 = Curl_conn_setup(data,conn,1,local_158,*(uint *)&conn->bits >> 0x11 & 1);
  if (CVar10 == CURLE_OK) {
    if (((data->set).field_0x89f & 0x40) != 0) {
      pcVar11 = (conn->proto).ftpc.newhost;
      Curl_printable_address(local_158->addr,(char *)&local_138,0x100);
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"Connecting to %s (%s) port %d",pcVar11,&local_138,(ulong)uVar7);
      }
    }
    Curl_resolv_unlink(data,&local_158);
    (*Curl_cfree)(conn->secondaryhostname);
    conn->secondary_port = (conn->proto).ftpc.newport;
    pcVar11 = (*Curl_cstrdup)((conn->proto).ftpc.newhost);
    conn->secondaryhostname = pcVar11;
    if (pcVar11 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar2 = &(conn->bits).field_0x1;
    *puVar2 = *puVar2 | 0x10;
    _ftp_state(data,'\0');
    return CURLE_OK;
  }
  Curl_resolv_unlink(data,&local_158);
  if (ftpcode != 0xe5) {
    return CVar10;
  }
  if ((conn->proto).ftpc.count1 == 0) {
    CVar10 = ftp_epsv_disable(data,conn);
    return CVar10;
  }
  return CVar10;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct Curl_dns_entry *dns = NULL;
  unsigned short connectport; /* the local port connect() should use! */
  struct pingpong *pp = &ftpc->pp;
  char *str =
    Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      char sep;
      ptr++;
      /* |||12345| */
      sep = ptr[0];
      if((ptr[1] == sep) && (ptr[2] == sep) && ISDIGIT(ptr[3])) {
        const char *p = &ptr[3];
        curl_off_t num;
        if(Curl_str_number(&p, &num, 0xffff) || (*p != sep)) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        ftpc->newport = (unsigned short)num;
        ftpc->newhost = strdup(control_address(conn));
        if(!ftpc->newhost)
          return CURLE_OUT_OF_MEMORY;
      }
      else
        ptr = NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    unsigned int ip[6];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(match_pasv_6nums(str, ip))
        break;
      str++;
    }

    if(!*str) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %u.%u.%u.%u for data connection, reuse %s instead",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((ip[4] << 8) + ip[5]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(data, conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We do not want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    const char * const host_name = conn->bits.socksproxy ?
      conn->socks_proxy.host.name : conn->http_proxy.host.name;
    (void)Curl_resolv_blocking(data, host_name, conn->primary.remote_port,
                               conn->ip_version, &dns);
    /* we connect to the proxy's port */
    connectport = (unsigned short)conn->primary.remote_port;

    if(!dns) {
      failf(data, "cannot resolve proxy host %s:%hu", host_name, connectport);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else
#endif
  {
    /* normal, direct, ftp connection */
    DEBUGASSERT(ftpc->newhost);

    /* postponed address resolution in case of tcp fastopen */
    if(conn->bits.tcp_fastopen && !conn->bits.reuse && !ftpc->newhost[0]) {
      free(ftpc->newhost);
      ftpc->newhost = strdup(control_address(conn));
      if(!ftpc->newhost)
        return CURLE_OUT_OF_MEMORY;
    }

    (void)Curl_resolv_blocking(data, ftpc->newhost, ftpc->newport,
                               conn->ip_version, &dns);
    connectport = ftpc->newport; /* we connect to the remote port */

    if(!dns) {
      failf(data, "cannot resolve new host %s:%hu",
            ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  result = Curl_conn_setup(data, conn, SECONDARYSOCKET, dns,
                           conn->bits.ftp_use_data_ssl ?
                           CURL_CF_SSL_ENABLE : CURL_CF_SSL_DISABLE);

  if(result) {
    Curl_resolv_unlink(data, &dns); /* we are done using this dns entry */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(data, conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(data, dns->addr, ftpc->newhost, connectport);

  Curl_resolv_unlink(data, &dns); /* we are done using this address */

  free(conn->secondaryhostname);
  conn->secondary_port = ftpc->newport;
  conn->secondaryhostname = strdup(ftpc->newhost);
  if(!conn->secondaryhostname)
    return CURLE_OUT_OF_MEMORY;

  conn->bits.do_more = TRUE;
  ftp_state(data, FTP_STOP); /* this phase is completed */

  return result;
}